

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool set_default_voice_dir_path(OpenJTalk *oj)

{
  _Bool _Var1;
  char **ppcVar2;
  bool bVar3;
  char temp [260];
  char acStack_138 [272];
  
  if (oj != (OpenJTalk *)0x0) {
    memset(acStack_138,0,0x104);
    if (g_data_install_path[0] == '\0') {
      return false;
    }
    bVar3 = G_DEFAULT_VOICE_DIR_NAMES[0] == (char *)0x0;
    if (!bVar3) {
      _Var1 = search_directory_or_file
                        (g_data_install_path,G_DEFAULT_VOICE_DIR_NAMES[0],true,acStack_138);
      if (!_Var1) {
        ppcVar2 = G_DEFAULT_VOICE_DIR_NAMES;
        do {
          ppcVar2 = ppcVar2 + 1;
          bVar3 = *ppcVar2 == (char *)0x0;
          if (bVar3) {
            return false;
          }
          _Var1 = search_directory_or_file(g_data_install_path,*ppcVar2,true,acStack_138);
        } while (!_Var1);
      }
      if (!bVar3) {
        strcpy(oj->dn_voice_dir_path,acStack_138);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool set_default_voice_dir_path(OpenJTalk *oj)
{
	if (!oj)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 標準のインストールフォルダから可能性のある名前を探す
	if (g_data_install_path != NULL && strlen(g_data_install_path) != 0)
	{
		for (const char **d = G_DEFAULT_VOICE_DIR_NAMES; *d != NULL; d++)
		{
			if (search_directory(g_data_install_path, *d, temp))
			{
				goto return_true;
			}
		}
	}
	return false;

return_true:
	strcpy(oj->dn_voice_dir_path, temp);
	return true;
}